

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O2

bool __thiscall
ArgsManager::ReadConfigFiles(ArgsManager *this,string *error,bool ignore_invalid_keys)

{
  int iVar1;
  string arg;
  pointer pbVar2;
  bool bVar3;
  __type_conflict _Var4;
  mapped_type *vec;
  size_t skip;
  size_t skip_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  path *ppVar6;
  bool bVar7;
  string *conf_file_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  uint uVar8;
  pointer __source;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  undefined4 in_stack_fffffffffffffa90;
  undefined4 in_stack_fffffffffffffa94;
  undefined8 in_stack_fffffffffffffa98;
  undefined8 in_stack_fffffffffffffaa0;
  anon_class_16_2_d914f46d add_includes;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  conf_file_names;
  path local_528;
  path local_500;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock4;
  __native_type local_4c8 [12];
  string chain_id;
  ifstream stream;
  int aiStack_290 [122];
  path conf_path;
  undefined1 local_80 [32];
  path local_60;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&conf_path,&this->cs_args,
             "cs_args",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/common/config.cpp"
             ,0x7c,false);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
  ::clear(&(this->m_settings).ro_config._M_t);
  std::__cxx11::list<SectionInfo,_std::allocator<SectionInfo>_>::clear(&this->m_config_sections);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_80,"-conf",(allocator<char> *)&local_500);
  fs::path::path((path *)(local_80 + 0x20),"bitcoin.conf");
  arg._M_string_length._0_4_ = in_stack_fffffffffffffa90;
  arg._M_dataplus._M_p = (pointer)error;
  arg._M_string_length._4_4_ = in_stack_fffffffffffffa94;
  arg.field_2._M_allocated_capacity = in_stack_fffffffffffffa98;
  arg.field_2._8_8_ = in_stack_fffffffffffffaa0;
  GetPathArg((path *)&criticalblock4,this,arg,(path *)local_80);
  pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  AbsPathForConfigVal((path *)&stream,this,(path *)&criticalblock4,false);
  std::optional<fs::path>::operator=(&this->m_config_path,(path *)&stream);
  std::filesystem::__cxx11::path::~path((path *)&stream);
  std::filesystem::__cxx11::path::~path((path *)&criticalblock4);
  std::filesystem::__cxx11::path::~path((path *)(local_80 + 0x20));
  std::__cxx11::string::~string((string *)local_80);
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)&conf_path);
  GetConfigFilePath(&conf_path,this);
  std::ifstream::ifstream(&stream,conf_path.super_path._M_pathname._M_dataplus._M_p,_S_in);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&criticalblock4,"-conf",(allocator<char> *)(local_80 + 0x20));
  bVar3 = IsArgSet(this,(string *)&criticalblock4);
  if (bVar3) {
    iVar1 = *(int *)((long)aiStack_290 + *(long *)((long)_stream + -0x18));
    std::__cxx11::string::~string((string *)&criticalblock4);
    if (iVar1 == 0) goto LAB_00561a3e;
    std::filesystem::__cxx11::path::string((string *)(local_80 + 0x20),&conf_path.super_path);
    tinyformat::format<std::__cxx11::string>
              ((string *)&criticalblock4,
               (tinyformat *)"specified config file \"%s\" could not be opened.",local_80 + 0x20,
               pbVar5);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (error,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &criticalblock4);
    std::__cxx11::string::~string((string *)&criticalblock4);
    ppVar6 = (path *)(local_80 + 0x20);
LAB_00561b0f:
    std::__cxx11::string::~string((string *)ppVar6);
  }
  else {
    std::__cxx11::string::~string((string *)&criticalblock4);
LAB_00561a3e:
    if (*(int *)((long)aiStack_290 + *(long *)((long)_stream + -0x18)) != 0) {
LAB_00561a58:
      ClearPathCache(this);
      bVar3 = CheckDataDirOption(this);
      bVar7 = true;
      if (bVar3) goto LAB_00561b16;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_500,"-datadir",(allocator<char> *)&chain_id);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_528,"",(allocator<char> *)&conf_file_names);
      ppVar6 = &local_528;
      GetArg((string *)(local_80 + 0x20),this,&local_500._M_pathname,&ppVar6->_M_pathname);
      tinyformat::format<std::__cxx11::string>
                ((string *)&criticalblock4,
                 (tinyformat *)"specified data directory \"%s\" does not exist.",local_80 + 0x20,
                 &ppVar6->_M_pathname);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (error,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &criticalblock4);
      std::__cxx11::string::~string((string *)&criticalblock4);
      std::__cxx11::string::~string((string *)(local_80 + 0x20));
      std::__cxx11::string::~string((string *)&local_528);
      ppVar6 = &local_500;
      goto LAB_00561b0f;
    }
    std::filesystem::__cxx11::path::string((string *)&criticalblock4,&conf_path.super_path);
    uVar8 = (uint)ignore_invalid_keys;
    bVar3 = ReadConfigStream(this,(istream *)&stream,(string *)&criticalblock4,error,
                             ignore_invalid_keys);
    std::__cxx11::string::~string((string *)&criticalblock4);
    if (bVar3) {
      UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                (&criticalblock4,&this->cs_args,"cs_args",
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/common/config.cpp"
                 ,0x93,false);
      vec = common::
            FindKey<std::map<std::__cxx11::string,std::vector<UniValue,std::allocator<UniValue>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<UniValue,std::allocator<UniValue>>>>>&,char_const(&)[12]>
                      (&(this->m_settings).command_line_options,(char (*) [12])"includeconf");
      if (vec == (mapped_type *)0x0) {
        std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock4.super_unique_lock);
        GetChainTypeString_abi_cxx11_(&chain_id,this);
        add_includes.conf_file_names = &conf_file_names;
        conf_file_names.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        conf_file_names.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        conf_file_names.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        add_includes.this = this;
        skip = ReadConfigFiles::anon_class_16_2_d914f46d::operator()(&add_includes,&chain_id,0);
        criticalblock4.super_unique_lock._M_device = (mutex_type *)local_4c8;
        criticalblock4.super_unique_lock._M_owns = false;
        criticalblock4.super_unique_lock._9_7_ = 0;
        local_4c8[0].__size[0] = '\0';
        skip_00 = ReadConfigFiles::anon_class_16_2_d914f46d::operator()
                            (&add_includes,(string *)&criticalblock4,0);
        std::__cxx11::string::~string((string *)&criticalblock4);
        pbVar2 = conf_file_names.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        ppVar6 = (path *)(local_80 + 0x20);
        for (__source = conf_file_names.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start; __source != pbVar2;
            __source = __source + 1) {
          std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                    (ppVar6,__source,auto_format);
          std::filesystem::__cxx11::path::path(&local_528,ppVar6);
          std::filesystem::__cxx11::path::~path(ppVar6);
          AbsPathForConfigVal((path *)&local_500,this,(path *)&local_528,false);
          std::ifstream::ifstream
                    ((string *)&criticalblock4,local_500._M_pathname._M_dataplus._M_p,_S_in);
          std::filesystem::__cxx11::path::~path(&local_500);
          std::filesystem::__cxx11::path::~path(&local_528);
          if (*(int *)((long)local_4c8 +
                      *(long *)((long)&criticalblock4.super_unique_lock._M_device[-1].
                                       super___recursive_mutex_base._M_mutex + 0x10) + 0x10) != 0) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_80 + 0x20),"Failed to include configuration file ",__source);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(error,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (local_80 + 0x20));
            std::__cxx11::string::~string((string *)(local_80 + 0x20));
LAB_00561ec0:
            std::ifstream::~ifstream(&criticalblock4);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&conf_file_names);
            ppVar6 = (path *)&chain_id;
            goto LAB_00561b0f;
          }
          bVar3 = ReadConfigStream(this,(istream *)&criticalblock4,__source,error,SUB41(uVar8,0));
          if (!bVar3) goto LAB_00561ec0;
          logging_function._M_str = "ReadConfigFiles";
          logging_function._M_len = 0xf;
          source_file._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/common/config.cpp"
          ;
          source_file._M_len = 0x61;
          LogPrintFormatInternal<std::__cxx11::string>
                    (logging_function,source_file,0xb7,ALL,Info,(ConstevalFormatString<1U>)0x707022,
                     __source);
          std::ifstream::~ifstream((string *)&criticalblock4);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear(&conf_file_names);
        ReadConfigFiles::anon_class_16_2_d914f46d::operator()(&add_includes,&chain_id,skip);
        criticalblock4.super_unique_lock._M_device = (mutex_type *)local_4c8;
        criticalblock4.super_unique_lock._M_owns = false;
        criticalblock4.super_unique_lock._9_7_ = 0;
        local_4c8[0].__size[0] = '\0';
        ReadConfigFiles::anon_class_16_2_d914f46d::operator()
                  (&add_includes,(string *)&criticalblock4,skip_00);
        std::__cxx11::string::~string((string *)&criticalblock4);
        GetChainTypeString_abi_cxx11_((string *)&criticalblock4,this);
        _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&criticalblock4,&chain_id);
        args = conf_file_names.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
        pbVar5 = conf_file_names.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (!_Var4) {
          ReadConfigFiles::anon_class_16_2_d914f46d::operator()
                    (&add_includes,(string *)&criticalblock4,0);
          args = conf_file_names.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
          pbVar5 = conf_file_names.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        }
        for (; args != pbVar5; args = args + 1) {
          tinyformat::format<std::__cxx11::string>
                    ((ostream *)&std::cerr,
                     "warning: -includeconf cannot be used from included files; ignoring -includeconf=%s\n"
                     ,args);
        }
        std::__cxx11::string::~string((string *)&criticalblock4);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&conf_file_names);
        std::__cxx11::string::~string((string *)&chain_id);
      }
      else {
        common::SettingsSpan::SettingsSpan((SettingsSpan *)(local_80 + 0x20),vec);
        bVar3 = common::SettingsSpan::last_negated((SettingsSpan *)(local_80 + 0x20));
        if (!bVar3) {
          __assert_fail("common::SettingsSpan(*includes).last_negated()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/common/config.cpp"
                        ,0x96,"bool ArgsManager::ReadConfigFiles(std::string &, bool)");
        }
        std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock4.super_unique_lock);
      }
      goto LAB_00561a58;
    }
  }
  bVar7 = false;
LAB_00561b16:
  std::ifstream::~ifstream(&stream);
  std::filesystem::__cxx11::path::~path(&conf_path.super_path);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar7;
}

Assistant:

bool ArgsManager::ReadConfigFiles(std::string& error, bool ignore_invalid_keys)
{
    {
        LOCK(cs_args);
        m_settings.ro_config.clear();
        m_config_sections.clear();
        m_config_path = AbsPathForConfigVal(*this, GetPathArg("-conf", BITCOIN_CONF_FILENAME), /*net_specific=*/false);
    }

    const auto conf_path{GetConfigFilePath()};
    std::ifstream stream{conf_path};

    // not ok to have a config file specified that cannot be opened
    if (IsArgSet("-conf") && !stream.good()) {
        error = strprintf("specified config file \"%s\" could not be opened.", fs::PathToString(conf_path));
        return false;
    }
    // ok to not have a config file
    if (stream.good()) {
        if (!ReadConfigStream(stream, fs::PathToString(conf_path), error, ignore_invalid_keys)) {
            return false;
        }
        // `-includeconf` cannot be included in the command line arguments except
        // as `-noincludeconf` (which indicates that no included conf file should be used).
        bool use_conf_file{true};
        {
            LOCK(cs_args);
            if (auto* includes = common::FindKey(m_settings.command_line_options, "includeconf")) {
                // ParseParameters() fails if a non-negated -includeconf is passed on the command-line
                assert(common::SettingsSpan(*includes).last_negated());
                use_conf_file = false;
            }
        }
        if (use_conf_file) {
            std::string chain_id = GetChainTypeString();
            std::vector<std::string> conf_file_names;

            auto add_includes = [&](const std::string& network, size_t skip = 0) {
                size_t num_values = 0;
                LOCK(cs_args);
                if (auto* section = common::FindKey(m_settings.ro_config, network)) {
                    if (auto* values = common::FindKey(*section, "includeconf")) {
                        for (size_t i = std::max(skip, common::SettingsSpan(*values).negated()); i < values->size(); ++i) {
                            conf_file_names.push_back((*values)[i].get_str());
                        }
                        num_values = values->size();
                    }
                }
                return num_values;
            };

            // We haven't set m_network yet (that happens in SelectParams()), so manually check
            // for network.includeconf args.
            const size_t chain_includes = add_includes(chain_id);
            const size_t default_includes = add_includes({});

            for (const std::string& conf_file_name : conf_file_names) {
                std::ifstream conf_file_stream{AbsPathForConfigVal(*this, fs::PathFromString(conf_file_name), /*net_specific=*/false)};
                if (conf_file_stream.good()) {
                    if (!ReadConfigStream(conf_file_stream, conf_file_name, error, ignore_invalid_keys)) {
                        return false;
                    }
                    LogPrintf("Included configuration file %s\n", conf_file_name);
                } else {
                    error = "Failed to include configuration file " + conf_file_name;
                    return false;
                }
            }

            // Warn about recursive -includeconf
            conf_file_names.clear();
            add_includes(chain_id, /* skip= */ chain_includes);
            add_includes({}, /* skip= */ default_includes);
            std::string chain_id_final = GetChainTypeString();
            if (chain_id_final != chain_id) {
                // Also warn about recursive includeconf for the chain that was specified in one of the includeconfs
                add_includes(chain_id_final);
            }
            for (const std::string& conf_file_name : conf_file_names) {
                tfm::format(std::cerr, "warning: -includeconf cannot be used from included files; ignoring -includeconf=%s\n", conf_file_name);
            }
        }
    }

    // If datadir is changed in .conf file:
    ClearPathCache();
    if (!CheckDataDirOption(*this)) {
        error = strprintf("specified data directory \"%s\" does not exist.", GetArg("-datadir", ""));
        return false;
    }
    return true;
}